

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SystemIdentifier::Encode(SystemIdentifier *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  SystemIdentifier *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16SystemType);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16SystemName);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8SystemMode);
  KDataStream::operator<<(pKVar1,(this->field_3).m_ui8ChangeOptions);
  return;
}

Assistant:

void SystemIdentifier::Encode( KDataStream & stream ) const
{
    stream << m_ui16SystemType
           << m_ui16SystemName
           << m_ui8SystemMode
           << m_ui8ChangeOptions;
}